

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encoding.c
# Opt level: O0

void xmlIconvFree(void *vctxt)

{
  xmlIconvCtxt *ctxt;
  void *vctxt_local;
  
  if (vctxt != (void *)0x0) {
    if (*vctxt != -1) {
      iconv_close(*vctxt);
    }
    (*xmlFree)(vctxt);
  }
  return;
}

Assistant:

static void
xmlIconvFree(void *vctxt) {
    xmlIconvCtxt *ctxt = vctxt;

    if (ctxt == NULL)
        return;

    if (ctxt->cd != (iconv_t) -1)
        iconv_close(ctxt->cd);

    xmlFree(ctxt);
}